

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::RenderTestCase::iterate(RenderTestCase *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  RenderTarget *pRVar3;
  NotSupportedError *this_01;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar3->m_height;
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Render target size: ",0x14)
  ;
  std::ostream::operator<<(this_00,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
  std::ostream::operator<<(this_00,iVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  if ((199 < iVar1) && (199 < iVar2)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"Render target size must be at least ","");
  de::toString<int>(&local_1e8,&Functional::(anonymous_namespace)::TEST_CANVAS_SIZE);
  std::operator+(&local_1c8,&local_228,&local_1e8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_248._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_248._M_dataplus._M_p == psVar5) {
    local_248.field_2._M_allocated_capacity = *psVar5;
    local_248.field_2._8_8_ = plVar4[3];
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar5;
  }
  local_248._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  de::toString<int>(&local_208,&Functional::(anonymous_namespace)::TEST_CANVAS_SIZE);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 &local_248,&local_208);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1a8);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RenderTestCase::IterateResult RenderTestCase::iterate (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	m_testCtx.getLog() << TestLog::Message << "Render target size: " << width << "x" << height << TestLog::EndMessage;
	if (width < TEST_CANVAS_SIZE || height < TEST_CANVAS_SIZE)
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(TEST_CANVAS_SIZE) + "x" + de::toString(TEST_CANVAS_SIZE));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // success by default
	testRender();

	return STOP;
}